

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  
  this_00 = &this[-1].super_IfcTask.field_0x48;
  *(undefined8 *)&this[-1].super_IfcTask.field_0x48 = 0x9538d0;
  *(undefined8 *)&(this->super_IfcTask).field_0x30 = 0x9539c0;
  *(undefined8 *)&this[-1].super_IfcTask.field_0xd0 = 0x9538f8;
  this[-1].super_IfcTask.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>.
  _vptr_ObjectHelper = (_func_int **)0x953920;
  this[-1].super_IfcTask.Status.ptr._M_string_length = 0x953948;
  *(undefined8 *)((long)&this[-1].super_IfcTask.Status.ptr.field_2 + 8) = 0x953970;
  *(undefined8 *)&this->super_IfcTask = 0x953998;
  puVar1 = *(undefined1 **)&(this->super_IfcTask).field_0x10;
  if (puVar1 != &(this->super_IfcTask).field_0x20) {
    operator_delete(puVar1);
  }
  IfcTask::~IfcTask((IfcTask *)this_00,&PTR_construction_vtable_24__009539d8);
  operator_delete(this_00);
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}